

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetExecutableNames
          (cmGeneratorTarget *this,string *name,string *realName,string *impName,string *pdbName,
          string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  string prefix;
  string base;
  string suffix;
  string local_e8;
  string *local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_e8.field_2;
  local_c8 = name;
  local_58 = impName;
  if (this->Target->IsImportedTarget == true) {
    local_a0._M_dataplus._M_p = (pointer)0x2e;
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    local_e8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_a0);
    local_e8.field_2._M_allocated_capacity = (size_type)local_a0._M_dataplus._M_p;
    builtin_strncpy(local_e8._M_dataplus._M_p,"GetExecutableNames called on imported target: ",0x2e)
    ;
    local_e8._M_string_length = (size_type)local_a0._M_dataplus._M_p;
    local_e8._M_dataplus._M_p[(long)local_a0._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_e8,(ulong)(this->Target->Name)._M_dataplus._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_e8._M_string_length = 7;
  local_e8.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_60 = pdbName;
  pcVar3 = GetProperty(this,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (this->Target->TargetTypeValue == EXECUTABLE) {
    local_e8.field_2._M_allocated_capacity._0_6_ = 0x45444f4358;
    local_e8._M_string_length = 5;
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = cmMakefile::IsOn(this->Makefile,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) goto LAB_00498675;
  }
  pcVar3 = (char *)0x0;
LAB_00498675:
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity =
       local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&local_e8,&local_a0,&local_80);
  std::operator+(&local_50,&local_e8,&local_a0);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_80._M_dataplus._M_p);
  paVar1 = &local_c0.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_c0.field_2._M_allocated_capacity = *psVar5;
    local_c0.field_2._8_8_ = plVar4[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar5;
    local_c0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_c8,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)realName);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::append((char *)realName);
    std::__cxx11::string::append((char *)realName);
  }
  GetFullNameInternal(&local_c0,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  GetPDBName(&local_c0,this,config);
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetExecutableNames(std::string& name,
                                           std::string& realName,
                                           std::string& impName,
                                           std::string& pdbName,
                                           const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = CM_NULLPTR;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, base, suffix);

  // The executable name.
  name = prefix + base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  realName = prefix + base;
#else
  realName = name;
#endif
  if (version) {
    realName += "-";
    realName += version;
  }
#if defined(__CYGWIN__)
  realName += suffix;
#endif

  // The import library name.
  impName =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  pdbName = this->GetPDBName(config);
}